

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O2

void LZ4HC_setExternalDict(LZ4HC_CCtx_internal *ctxPtr,BYTE *newBlock)

{
  uint uVar1;
  LZ4_byte *pLVar2;
  LZ4_byte *pLVar3;
  LZ4_u32 LVar4;
  BYTE *base;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  pLVar2 = ctxPtr->end;
  pLVar3 = ctxPtr->base;
  uVar1 = ctxPtr->dictLimit;
  if (pLVar3 + (ulong)uVar1 + 4 <= pLVar2) {
    for (uVar6 = (ulong)ctxPtr->nextToUpdate; uVar6 < ((int)pLVar2 - (int)pLVar3) - 3;
        uVar6 = uVar6 + 1) {
      uVar7 = (uint)(*(int *)(pLVar3 + uVar6) * -0x61c8864f) >> 0x11;
      uVar5 = (uint)uVar6;
      uVar8 = uVar5 - ctxPtr->hashTable[uVar7];
      if (0xfffe < uVar8) {
        uVar8 = 0xffff;
      }
      ctxPtr->chainTable[uVar5 & 0xffff] = (LZ4_u16)uVar8;
      ctxPtr->hashTable[uVar7] = uVar5;
    }
  }
  ctxPtr->lowLimit = uVar1;
  LVar4 = (LZ4_u32)((long)pLVar2 - (long)pLVar3);
  ctxPtr->dictLimit = LVar4;
  ctxPtr->dictBase = pLVar3;
  ctxPtr->base = newBlock + -((long)pLVar2 - (long)pLVar3 & 0xffffffffU);
  ctxPtr->end = newBlock;
  ctxPtr->nextToUpdate = LVar4;
  ctxPtr->dictCtx = (LZ4HC_CCtx_internal *)0x0;
  return;
}

Assistant:

static void LZ4HC_setExternalDict(LZ4HC_CCtx_internal* ctxPtr, const BYTE* newBlock)
{
    DEBUGLOG(4, "LZ4HC_setExternalDict(%p, %p)", ctxPtr, newBlock);
    if (ctxPtr->end >= ctxPtr->base + ctxPtr->dictLimit + 4)
        LZ4HC_Insert (ctxPtr, ctxPtr->end-3);   /* Referencing remaining dictionary content */

    /* Only one memory segment for extDict, so any previous extDict is lost at this stage */
    ctxPtr->lowLimit  = ctxPtr->dictLimit;
    ctxPtr->dictLimit = (U32)(ctxPtr->end - ctxPtr->base);
    ctxPtr->dictBase  = ctxPtr->base;
    ctxPtr->base = newBlock - ctxPtr->dictLimit;
    ctxPtr->end  = newBlock;
    ctxPtr->nextToUpdate = ctxPtr->dictLimit;   /* match referencing will resume from there */

    /* cannot reference an extDict and a dictCtx at the same time */
    ctxPtr->dictCtx = NULL;
}